

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O0

bool __thiscall DIS::AggregateStatePdu::operator==(AggregateStatePdu *this,AggregateStatePdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  const_reference this_01;
  const_reference rhs_01;
  const_reference pvVar3;
  const_reference pvVar4;
  const_reference this_02;
  const_reference rhs_02;
  ulong local_48;
  size_t idx_4;
  size_t idx_3;
  size_t idx_2;
  size_t idx_1;
  size_t idx;
  bool ivarsEqual;
  AggregateStatePdu *rhs_local;
  AggregateStatePdu *this_local;
  
  idx._7_1_ = EntityManagementFamilyPdu::operator==
                        (&this->super_EntityManagementFamilyPdu,
                         &rhs->super_EntityManagementFamilyPdu);
  bVar1 = EntityID::operator==(&this->_aggregateID,&rhs->_aggregateID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_forceID != rhs->_forceID) {
    idx._7_1_ = false;
  }
  if (this->_aggregateState != rhs->_aggregateState) {
    idx._7_1_ = false;
  }
  bVar1 = EntityType::operator==(&this->_aggregateType,&rhs->_aggregateType);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_formation != rhs->_formation) {
    idx._7_1_ = false;
  }
  bVar1 = AggregateMarking::operator==(&this->_aggregateMarking,&rhs->_aggregateMarking);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = Vector3Float::operator==(&this->_dimensions,&rhs->_dimensions);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = Orientation::operator==(&this->_orientation,&rhs->_orientation);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = Vector3Double::operator==(&this->_centerOfMass,&rhs->_centerOfMass);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = Vector3Float::operator==(&this->_velocity,&rhs->_velocity);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  idx_1 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::size
                      (&this->_aggregateIDList);
    if (sVar2 <= idx_1) break;
    this_00 = std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::operator[]
                        (&this->_aggregateIDList,idx_1);
    rhs_00 = std::vector<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>::operator[]
                       (&rhs->_aggregateIDList,idx_1);
    bVar1 = AggregateID::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    idx_1 = idx_1 + 1;
  }
  idx_2 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::size(&this->_entityIDList);
    if (sVar2 <= idx_2) break;
    this_01 = std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::operator[]
                        (&this->_entityIDList,idx_2);
    rhs_01 = std::vector<DIS::EntityID,_std::allocator<DIS::EntityID>_>::operator[]
                       (&rhs->_entityIDList,idx_2);
    bVar1 = EntityID::operator==(this_01,rhs_01);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    idx_2 = idx_2 + 1;
  }
  if (this->_pad2 != rhs->_pad2) {
    idx._7_1_ = false;
  }
  idx_3 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::size
                      (&this->_silentAggregateSystemList);
    if (sVar2 <= idx_3) break;
    pvVar3 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::operator[]
                       (&this->_silentAggregateSystemList,idx_3);
    pvVar4 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::operator[]
                       (&rhs->_silentAggregateSystemList,idx_3);
    bVar1 = EntityType::operator==(pvVar3,pvVar4);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    idx_3 = idx_3 + 1;
  }
  idx_4 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::size
                      (&this->_silentEntitySystemList);
    if (sVar2 <= idx_4) break;
    pvVar3 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::operator[]
                       (&this->_silentEntitySystemList,idx_4);
    pvVar4 = std::vector<DIS::EntityType,_std::allocator<DIS::EntityType>_>::operator[]
                       (&rhs->_silentEntitySystemList,idx_4);
    bVar1 = EntityType::operator==(pvVar3,pvVar4);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    idx_4 = idx_4 + 1;
  }
  local_48 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                      (&this->_variableDatumList);
    if (sVar2 <= local_48) break;
    this_02 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                        (&this->_variableDatumList,local_48);
    rhs_02 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                       (&rhs->_variableDatumList,local_48);
    bVar1 = VariableDatum::operator==(this_02,rhs_02);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_48 = local_48 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool AggregateStatePdu::operator ==(const AggregateStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = EntityManagementFamilyPdu::operator==(rhs);

     if( ! (_aggregateID == rhs._aggregateID) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_aggregateState == rhs._aggregateState) ) ivarsEqual = false;
     if( ! (_aggregateType == rhs._aggregateType) ) ivarsEqual = false;
     if( ! (_formation == rhs._formation) ) ivarsEqual = false;
     if( ! (_aggregateMarking == rhs._aggregateMarking) ) ivarsEqual = false;
     if( ! (_dimensions == rhs._dimensions) ) ivarsEqual = false;
     if( ! (_orientation == rhs._orientation) ) ivarsEqual = false;
     if( ! (_centerOfMass == rhs._centerOfMass) ) ivarsEqual = false;
     if( ! (_velocity == rhs._velocity) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _aggregateIDList.size(); idx++)
     {
        if( ! ( _aggregateIDList[idx] == rhs._aggregateIDList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _entityIDList.size(); idx++)
     {
        if( ! ( _entityIDList[idx] == rhs._entityIDList[idx]) ) ivarsEqual = false;
     }

     if( ! (_pad2 == rhs._pad2) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _silentAggregateSystemList.size(); idx++)
     {
        if( ! ( _silentAggregateSystemList[idx] == rhs._silentAggregateSystemList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _silentEntitySystemList.size(); idx++)
     {
        if( ! ( _silentEntitySystemList[idx] == rhs._silentEntitySystemList[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatumList.size(); idx++)
     {
        if( ! ( _variableDatumList[idx] == rhs._variableDatumList[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }